

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createUnknown(LLVMPointerGraphBuilder *this,Value *val)

{
  PSNodesSeq *pPVar1;
  PSNode *in_RSI;
  Value *in_RDI;
  LLVMPointerGraphBuilder *unaff_retaddr;
  PSNode *node;
  PSNode **in_stack_ffffffffffffffe8;
  
  PointerGraph::create<(dg::pta::PSNodeType)18,dg::pta::PSNode*&,unsigned_long_const&>
            ((PointerGraph *)in_RSI,in_stack_ffffffffffffffe8,(unsigned_long *)in_RDI);
  pPVar1 = addNode(unaff_retaddr,in_RDI,in_RSI);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createUnknown(const llvm::Value *val) {
    // nothing better we can do, these operations
    // completely change the value of pointer...

    // FIXME: or there's enough unknown offset? Check it out!
    PSNode *node =
            PS.create<PSNodeType::CONSTANT>(UNKNOWN_MEMORY, Offset::UNKNOWN);
    assert(node);

    return addNode(val, node);
}